

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_input(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  size_t *psVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  ptls_buffer_t *ppVar4;
  int iVar5;
  uint uVar6;
  ptls_buffer_t *ppVar7;
  uint uVar8;
  int iVar9;
  uint8_t *puVar10;
  ushort uVar11;
  undefined1 *puVar12;
  ptls_handshake_properties_t *ppVar13;
  anon_struct_64_2_7cec4369_for_recvbuf *buf;
  ptls_handshake_properties_t *properties_00;
  size_t sVar14;
  ptls_buffer_t *ppVar15;
  ulong uVar16;
  size_t decrypted_length;
  ptls_message_emitter_t local_78;
  ptls_handshake_properties_t *local_50;
  anon_struct_64_2_7cec4369_for_recvbuf *local_48;
  undefined1 *local_40;
  ptls_handshake_properties_t *local_38;
  
  ppVar15 = local_78.buf;
  properties_00 = (ptls_handshake_properties_t *)inlen;
  if ((tls->field_0x160 & 0x20) == 0) {
    puVar3 = (tls->recvbuf).rec.base;
    if ((puVar3 == (uint8_t *)0x0) && ((uint8_t *)0x4 < (uint8_t *)*inlen)) {
      local_78.buf = (ptls_buffer_t *)CONCAT71(local_78.buf._1_7_,*input);
      ppVar7 = local_78.buf;
      local_78.buf._4_4_ = SUB84(ppVar15,4);
      local_78.buf._0_2_ = SUB82(ppVar7,0);
      local_78.buf._0_4_ =
           CONCAT22(*(ushort *)((long)input + 1) << 8 | *(ushort *)((long)input + 1) >> 8,
                    local_78.buf._0_2_);
      uVar11 = *(ushort *)((long)input + 3) << 8 | *(ushort *)((long)input + 3) >> 8;
      local_78.enc = (st_ptls_traffic_protection_t *)(ulong)uVar11;
      ppVar13 = (ptls_handshake_properties_t *)((ulong)(*input == '\x17') << 8 | 0x4000);
      properties_00 = (ptls_handshake_properties_t *)0x0;
      iVar5 = 0x32;
      if (local_78.enc <= ppVar13) {
        iVar5 = 0;
      }
      if ((uint)uVar11 <= (uint)ppVar13) {
        puVar10 = (uint8_t *)((long)&((ptls_handshake_properties_t *)local_78.enc)->field_0 + 5);
        if ((uint8_t *)*inlen < puVar10) goto LAB_001111ba;
        local_78.record_header_length = (long)input + 5;
        iVar5 = 0;
        goto LAB_001113a1;
      }
    }
    else {
LAB_001111ba:
      buf = &tls->recvbuf;
      ppVar15 = (ptls_buffer_t *)*inlen;
      local_78.buf = (ptls_buffer_t *)0x0;
      local_78.enc = (st_ptls_traffic_protection_t *)0x0;
      local_78.record_header_length = 0;
      if (puVar3 == (uint8_t *)0x0) {
        (tls->recvbuf).rec.base = "";
        (tls->recvbuf).rec.capacity = 0;
        (tls->recvbuf).rec.off = 0;
        (tls->recvbuf).rec.is_allocated = 0;
        local_78.commit_message = (_func_int_st_ptls_message_emitter_t_ptr *)ppVar15;
        iVar5 = ptls_buffer_reserve(&buf->rec,5);
        ppVar15 = (ptls_buffer_t *)local_78.commit_message;
        if (iVar5 != 0) goto LAB_001113a5;
      }
      ppVar4 = local_78.buf;
      uVar16 = (tls->recvbuf).rec.off;
      puVar10 = (uint8_t *)input;
      ppVar7 = ppVar15;
      while (uVar16 < 5) {
        if (ppVar7 == (ptls_buffer_t *)0x0) {
          iVar5 = 0x202;
          goto LAB_001113a5;
        }
        uVar2 = *puVar10;
        properties_00 =
             (ptls_handshake_properties_t *)CONCAT71((int7)((ulong)properties_00 >> 8),uVar2);
        puVar10 = puVar10 + 1;
        puVar3 = (tls->recvbuf).rec.base;
        (tls->recvbuf).rec.off = uVar16 + 1;
        puVar3[uVar16] = uVar2;
        ppVar7 = (ptls_buffer_t *)&ppVar7[-1].field_0x1f;
        uVar16 = (tls->recvbuf).rec.off;
      }
      puVar3 = (buf->rec).base;
      local_78.buf = (ptls_buffer_t *)CONCAT71(local_78.buf._1_7_,*puVar3);
      ppVar7 = local_78.buf;
      local_78.buf._4_4_ = SUB84(ppVar4,4);
      local_78.buf._0_2_ = SUB82(ppVar7,0);
      local_78.buf._0_4_ =
           CONCAT22(*(ushort *)(puVar3 + 1) << 8 | *(ushort *)(puVar3 + 1) >> 8,local_78.buf._0_2_);
      uVar11 = *(ushort *)(puVar3 + 3) << 8 | *(ushort *)(puVar3 + 3) >> 8;
      properties_00 = (ptls_handshake_properties_t *)(ulong)uVar11;
      ppVar13 = (ptls_handshake_properties_t *)((ulong)(*puVar3 == '\x17') << 8 | 0x4000);
      iVar5 = 0x32;
      if (properties_00 <= ppVar13) {
        iVar5 = 0;
      }
      local_78.enc = (st_ptls_traffic_protection_t *)properties_00;
      if ((uint)uVar11 <= (uint)ppVar13) {
        puVar12 = (undefined1 *)((long)&properties_00->field_0 + 5);
        sVar14 = (long)puVar12 - uVar16;
        if (sVar14 != 0) {
          local_78.commit_message = (_func_int_st_ptls_message_emitter_t_ptr *)decryptbuf;
          local_50 = properties;
          local_40 = puVar12;
          iVar5 = ptls_buffer_reserve(&buf->rec,sVar14);
          decryptbuf = (ptls_buffer_t *)local_78.commit_message;
          properties = local_50;
          if (iVar5 != 0) goto LAB_001113a5;
          uVar16 = ((long)input + (long)ppVar15) - (long)puVar10;
          if (sVar14 < uVar16) {
            uVar16 = sVar14;
          }
          puVar12 = local_40;
          local_48 = buf;
          if (uVar16 != 0) {
            memcpy((tls->recvbuf).rec.base + (tls->recvbuf).rec.off,puVar10,uVar16);
            psVar1 = &(tls->recvbuf).rec.off;
            *psVar1 = *psVar1 + uVar16;
            puVar10 = puVar10 + uVar16;
            decryptbuf = (ptls_buffer_t *)local_78.commit_message;
            puVar12 = local_40;
            buf = local_48;
            properties = local_50;
          }
        }
        iVar5 = 0x202;
        if ((undefined1 *)(tls->recvbuf).rec.off == puVar12) {
          local_78.record_header_length = (size_t)((buf->rec).base + 5);
          iVar5 = 0;
        }
        puVar10 = puVar10 + (*inlen - ((long)input + (long)ppVar15));
LAB_001113a1:
        *inlen = (size_t)puVar10;
      }
    }
LAB_001113a5:
    sVar14 = local_78.record_header_length;
    ppVar13 = (ptls_handshake_properties_t *)local_78.enc;
    if (iVar5 != 0) {
      return iVar5;
    }
    if ((uint8_t *)local_78.record_header_length == (uint8_t *)0x0) {
      __assert_fail("rec.fragment != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                    ,0x11a7,
                    "int handle_input(ptls_t *, ptls_message_emitter_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
    if ((char)local_78.buf == '\x14') {
      if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
        return 0x28;
      }
      if ((ptls_handshake_properties_t *)local_78.enc != (ptls_handshake_properties_t *)0x1) {
        return 0x2f;
      }
      uVar6 = 0x202;
      if (*(uint8_t *)local_78.record_header_length != '\x01') {
        return 0x2f;
      }
      goto LAB_001114d8;
    }
    if (((char)local_78.buf == '\x15') ||
       ((tls->traffic_protection).dec.aead == (ptls_aead_context_t *)0x0)) {
      if (((char)local_78.buf != '\x17') ||
         (((tls->field_0x160 & 1) == 0 ||
          ((tls->field_20).server.early_data_skipped_bytes == 0xffffffff)))) goto LAB_0011148e;
    }
    else {
      iVar9 = 1;
      iVar5 = 0x28;
      if (((char)local_78.buf == '\x17') &&
         (iVar5 = ptls_buffer_reserve(decryptbuf,(size_t)((long)(local_78.enc)->secret + 5)),
         iVar5 == 0)) {
        iVar5 = aead_decrypt(&(tls->traffic_protection).dec,decryptbuf->base + decryptbuf->off,
                             (size_t *)&local_38,(void *)sVar14,(size_t)ppVar13);
        if (iVar5 == 0) {
          local_78.record_header_length = (size_t)(decryptbuf->base + decryptbuf->off);
          properties_00 =
               (ptls_handshake_properties_t *)
               CONCAT71((int7)((ulong)ppVar13 >> 8),local_38 == (ptls_handshake_properties_t *)0x0);
          if (local_38 == (ptls_handshake_properties_t *)0x0) {
LAB_00111640:
            iVar5 = 10;
            local_78.enc = (st_ptls_traffic_protection_t *)local_38;
          }
          else {
            if (((uint8_t *)(local_78.record_header_length + -1))[(long)local_38] == '\0') {
              ppVar13 = local_38;
              do {
                properties_00 =
                     (ptls_handshake_properties_t *)
                     CONCAT71((int7)((ulong)properties_00 >> 8),
                              ppVar13 == (ptls_handshake_properties_t *)0x1);
                if (ppVar13 == (ptls_handshake_properties_t *)0x1) {
                  local_38 = (ptls_handshake_properties_t *)0x0;
                  goto LAB_00111640;
                }
                local_38 = (ptls_handshake_properties_t *)
                           ((long)&ppVar13[-1].collected_extensions + 7);
                puVar3 = decryptbuf->base + (decryptbuf->off - 2) + (long)ppVar13;
                ppVar13 = local_38;
              } while (*puVar3 == '\0');
            }
            iVar5 = 10;
            local_78.enc = (st_ptls_traffic_protection_t *)local_38;
            if ((char)properties_00 == '\0') {
              local_78.enc = (st_ptls_traffic_protection_t *)
                             ((long)&local_38[-1].collected_extensions + 7);
              iVar5 = (int)CONCAT71((int7)((ulong)local_78.enc >> 8),
                                    ((uint8_t *)(local_78.record_header_length + -1))
                                    [(long)local_38]);
              local_78.buf = (ptls_buffer_t *)
                             CONCAT71(local_78.buf._1_7_,
                                      ((uint8_t *)(local_78.record_header_length + -1))
                                      [(long)local_38]);
              iVar9 = 0;
            }
          }
        }
        else {
          properties_00 = ppVar13;
          if (((tls->field_0x160 & 1) != 0) &&
             ((tls->field_20).server.early_data_skipped_bytes != 0xffffffff)) {
            iVar9 = 4;
          }
        }
      }
      if (iVar9 == 0) {
LAB_0011148e:
        if ((char)local_78.buf != '\x16' && (tls->recvbuf).mess.base == (uint8_t *)0x0) {
          if ((char)local_78.buf == '\x15') {
            uVar6 = 0x32;
            if ((ptls_handshake_properties_t *)local_78.enc == (ptls_handshake_properties_t *)0x2) {
              uVar6 = *(byte *)(local_78.record_header_length + 1) | 0x100;
            }
          }
          else {
            uVar6 = 10;
            if ((char)local_78.buf == '\x17') {
              if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
                if ((tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) &&
                   (uVar6 = 0, (tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0)) {
                  decryptbuf->off = (long)(local_78.enc)->secret + decryptbuf->off;
                }
              }
              else {
                decryptbuf->off = (long)(local_78.enc)->secret + decryptbuf->off;
                uVar6 = 0;
              }
            }
          }
          goto LAB_001114d8;
        }
        goto LAB_001114a9;
      }
      if (iVar9 != 4) {
        return iVar5;
      }
    }
    uVar8 = (tls->field_20).server.early_data_skipped_bytes + (int)local_78.enc;
    (tls->field_20).server.early_data_skipped_bytes = uVar8;
    uVar6 = 0x202;
    if (0x10000 < uVar8) {
      return 0x28;
    }
  }
  else {
LAB_001114a9:
    uVar6 = handle_handshake_record
                      (tls,(_func_int_ptls_t_ptr_ptls_message_emitter_t_ptr_ptls_iovec_t_int_ptls_handshake_properties_t_ptr
                            *)emitter,&local_78,(st_ptls_record_t *)properties,properties_00);
    if ((uVar6 == 0x202) && (uVar6 = 0x202, (tls->field_0x160 & 0x20) != 0)) {
      return 0x202;
    }
  }
LAB_001114d8:
  ptls_buffer__release_memory(&(tls->recvbuf).rec);
  (tls->recvbuf).rec.off = 0;
  *(undefined8 *)&(tls->recvbuf).rec.is_allocated = 0;
  (tls->recvbuf).rec.base = (uint8_t *)0x0;
  (tls->recvbuf).rec.capacity = 0;
  return uVar6;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    if (tls->in_handshake)
        goto resume_handshake;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (rec.type == PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC) {
        if (tls->state < PTLS_STATE_POST_HANDSHAKE_MIN) {
            if (!(rec.length == 1 && rec.fragment[0] == 0x01))
                return PTLS_ALERT_ILLEGAL_PARAMETER;
        } else {
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }
    if (tls->traffic_protection.dec.aead != NULL && rec.type != PTLS_CONTENT_TYPE_ALERT) {
        size_t decrypted_length;
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = aead_decrypt(&tls->traffic_protection.dec, decryptbuf->base + decryptbuf->off, &decrypted_length, rec.fragment,
                                rec.length)) != 0) {
            if (tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX)
                goto ServerSkipEarlyData;
            return ret;
        }
        rec.length = decrypted_length;
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    } else if (rec.type == PTLS_CONTENT_TYPE_APPDATA && tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX) {
        goto ServerSkipEarlyData;
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {
        /* handshake record */
resume_handshake:
        ret = handle_handshake_record(tls, handle_handshake_message, emitter, &rec, properties);
        if ((ret == PTLS_ERROR_IN_PROGRESS) && (tls->in_handshake))
            return ret;
    } else {
        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;

ServerSkipEarlyData:
    tls->server.early_data_skipped_bytes += (uint32_t)rec.length;
    if (tls->server.early_data_skipped_bytes > PTLS_MAX_EARLY_DATA_SKIP_SIZE)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    ret = PTLS_ERROR_IN_PROGRESS;
    goto NextRecord;
}